

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

int schemasTest(char *filename,char *resul,char *errr,int options)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  undefined8 uVar4;
  xmlSchemaPtr schemas_00;
  size_t sVar5;
  char *__s;
  ulong uStack_6b8;
  char count;
  size_t i;
  glob_t globbuf;
  char err [500];
  undefined1 local_468 [8];
  char prefix [500];
  char local_268 [8];
  char pattern [500];
  int parseErrorsSize;
  int ret;
  int len;
  int res;
  xmlSchemaPtr schemas;
  xmlSchemaParserCtxtPtr ctxt;
  char *instance;
  char *base2;
  char *base;
  int options_local;
  char *errr_local;
  char *resul_local;
  char *filename_local;
  
  pcVar3 = baseFilename(filename);
  ret = 0;
  uVar4 = xmlSchemaNewParserCtxt(filename);
  xmlSchemaSetParserStructuredErrors(uVar4,testStructuredErrorHandler,0);
  schemas_00 = (xmlSchemaPtr)xmlSchemaParse(uVar4);
  xmlSchemaFreeParserCtxt(uVar4);
  iVar1 = testErrorsSize;
  sVar5 = strlen(pcVar3);
  iVar2 = (int)sVar5;
  if ((iVar2 < 500) && (4 < iVar2)) {
    parseErrorsSize = iVar2 + -4;
    if (pcVar3[iVar2 + -6] == '_') {
      parseErrorsSize = iVar2 + -6;
    }
    if (pcVar3[parseErrorsSize + -2] == '_') {
      parseErrorsSize = parseErrorsSize + -2;
    }
    memcpy(local_468,pcVar3,(long)parseErrorsSize);
    local_468[parseErrorsSize] = 0;
    iVar2 = snprintf(local_268,499,"./test/schemas/%s_*.xml",local_468);
    if (0x1f2 < iVar2) {
      pattern[0x1eb] = '\0';
    }
    if (pcVar3[parseErrorsSize] == '_') {
      memcpy(local_468,pcVar3,(long)(parseErrorsSize + 2));
      local_468[parseErrorsSize + 2] = 0;
    }
    globbuf.gl_pathv = (char **)0x0;
    glob64(local_268,8,(__errfunc *)0x0,(glob64_t *)&i);
    for (uStack_6b8 = 0; uStack_6b8 < i; uStack_6b8 = uStack_6b8 + 1) {
      testErrorsSize = iVar1;
      testErrors[iVar1] = '\0';
      pcVar3 = *(char **)(globbuf.gl_pathc + uStack_6b8 * 8);
      __s = baseFilename(pcVar3);
      sVar5 = strlen(__s);
      iVar2 = (int)sVar5;
      if ((iVar2 < 7) || (__s[iVar2 + -6] != '_')) {
        fprintf(_stderr,"don\'t know how to process %s\n",pcVar3);
      }
      else {
        snprintf((char *)&globbuf.gl_stat,499,"result/schemas/%s_%c.err",local_468,
                 (ulong)(uint)(int)__s[iVar2 + -5]);
        nb_tests = nb_tests + 1;
        iVar2 = schemasOneTest(filename,pcVar3,(char *)&globbuf.gl_stat,options,schemas_00);
        if (iVar2 != 0) {
          ret = iVar2;
        }
      }
    }
    globfree64((glob64_t *)&i);
    xmlSchemaFree(schemas_00);
    filename_local._4_4_ = ret;
  }
  else {
    xmlSchemaFree(schemas_00);
    filename_local._4_4_ = -1;
  }
  return filename_local._4_4_;
}

Assistant:

static int
schemasTest(const char *filename,
            const char *resul ATTRIBUTE_UNUSED,
            const char *errr ATTRIBUTE_UNUSED,
            int options) {
    const char *base = baseFilename(filename);
    const char *base2;
    const char *instance;
    xmlSchemaParserCtxtPtr ctxt;
    xmlSchemaPtr schemas;
    int res = 0, len, ret;
    int parseErrorsSize;
    char pattern[500];
    char prefix[500];
    char err[500];
    glob_t globbuf;
    size_t i;
    char count = 0;

    /* first compile the schemas if possible */
    ctxt = xmlSchemaNewParserCtxt(filename);
    xmlSchemaSetParserStructuredErrors(ctxt, testStructuredErrorHandler, NULL);
    schemas = xmlSchemaParse(ctxt);
    xmlSchemaFreeParserCtxt(ctxt);
    parseErrorsSize = testErrorsSize;

    /*
     * most of the mess is about the output filenames generated by the Makefile
     */
    len = strlen(base);
    if ((len > 499) || (len < 5)) {
        xmlSchemaFree(schemas);
	return(-1);
    }
    len -= 4; /* remove trailing .xsd */
    if (base[len - 2] == '_') {
        len -= 2; /* remove subtest number */
    }
    if (base[len - 2] == '_') {
        len -= 2; /* remove subtest number */
    }
    memcpy(prefix, base, len);
    prefix[len] = 0;

    if (snprintf(pattern, 499, "./test/schemas/%s_*.xml", prefix) >= 499)
        pattern[499] = 0;

    if (base[len] == '_') {
        len += 2;
	memcpy(prefix, base, len);
	prefix[len] = 0;
    }

    globbuf.gl_offs = 0;
    glob(pattern, GLOB_DOOFFS, NULL, &globbuf);
    for (i = 0;i < globbuf.gl_pathc;i++) {
        testErrorsSize = parseErrorsSize;
        testErrors[parseErrorsSize] = 0;
        instance = globbuf.gl_pathv[i];
	base2 = baseFilename(instance);
	len = strlen(base2);
	if ((len > 6) && (base2[len - 6] == '_')) {
	    count = base2[len - 5];
	    ret = snprintf(err, 499, "result/schemas/%s_%c.err",
		     prefix, count);
            if (ret >= 499)
	        err[499] = 0;
	} else {
	    fprintf(stderr, "don't know how to process %s\n", instance);
	    continue;
	}

        nb_tests++;
        ret = schemasOneTest(filename, instance, err, options, schemas);
        if (ret != 0)
            res = ret;
    }
    globfree(&globbuf);
    xmlSchemaFree(schemas);

    return(res);
}